

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compact_upto_post_snapshot_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_kvs_handle *pfVar5;
  ulong uVar6;
  fdb_config *pfVar7;
  long extraout_RDX;
  char *pcVar8;
  fdb_config *fconfig_00;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  char *__format;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_handle *pfVar12;
  fdb_file_handle *pfVar13;
  fdb_iterator *pfVar14;
  fdb_kvs_handle *pfVar15;
  long lVar16;
  fdb_kvs_handle *unaff_R13;
  fdb_custom_cmp_variable p_Var17;
  undefined4 uVar18;
  undefined4 uVar19;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  fdb_file_handle *pfStackY_fc8;
  timeval tStackY_fc0;
  fdb_config fStackY_fb0;
  code *pcStackY_eb8;
  fdb_kvs_handle *pfStackY_eb0;
  fdb_kvs_handle *pfStackY_ea8;
  ulong uStackY_ea0;
  fdb_kvs_handle *pfStackY_e98;
  fdb_kvs_config fStackY_e90;
  timeval tStackY_e78;
  char *pcStackY_e68;
  char *pcStackY_e60;
  fdb_kvs_handle *pfStackY_e58;
  char *pcStackY_e50;
  char *pcStackY_e48;
  code *pcStackY_e40;
  fdb_file_handle *pfStackY_e30;
  int iStackY_e24;
  fdb_kvs_handle *pfStackY_e20;
  fdb_kvs_handle *pfStackY_e18;
  fdb_kvs_handle *pfStackY_e10;
  fdb_kvs_handle *pfStackY_e08;
  fdb_kvs_handle *pfStackY_e00;
  undefined8 uStackY_df8;
  undefined8 uStackY_df0;
  undefined8 uStackY_de8;
  timeval tStackY_dd8;
  fdb_kvs_config fStackY_dc8;
  fdb_config fStackY_db0;
  char acStackY_cb8 [256];
  char acStackY_bb8 [272];
  char *pcStackY_aa8;
  fdb_kvs_handle *pfStackY_aa0;
  char *pcStackY_a90;
  code *pcStackY_a88;
  fdb_snapshot_info_t *pfStackY_a78;
  fdb_kvs_handle *pfStackY_a70;
  uint64_t uStackY_a68;
  timeval tStackY_a60;
  size_t sStackY_a50;
  fdb_kvs_handle **ppfStackY_a48;
  code *pcStackY_a40;
  fdb_kvs_handle *pfStackY_a38;
  fdb_kvs_handle *pfStackY_a30;
  fdb_kvs_handle *pfStackY_a28;
  fdb_kvs_handle *pfStackY_a20;
  undefined8 uStackY_a18;
  undefined8 uStackY_a10;
  fdb_kvs_handle *pfStackY_a08;
  timeval tStackY_9f8;
  fdb_kvs_config fStackY_9e8;
  fdb_config fStackY_9d0;
  char acStackY_8d8 [256];
  fdb_kvs_handle *apfStackY_7d8 [33];
  fdb_config *pfStackY_6d0;
  fdb_kvs_handle *pfStackY_6c8;
  fdb_kvs_handle *pfStackY_6c0;
  char *pcStackY_6b8;
  fdb_kvs_handle *pfStackY_6b0;
  btree *pbStackY_6a8;
  fdb_iterator *pfStack_690;
  int iStack_684;
  fdb_kvs_handle *pfStack_680;
  fdb_file_handle *pfStack_678;
  fdb_kvs_handle *pfStack_670;
  char *pcStack_668;
  int iStack_660;
  undefined4 uStack_65c;
  fdb_snapshot_info_t *pfStack_658;
  fdb_kvs_handle *pfStack_650;
  fdb_kvs_handle *pfStack_648;
  long lStack_640;
  fdb_kvs_config fStack_638;
  char acStack_620 [256];
  timeval tStack_520;
  undefined1 auStack_510 [48];
  fdb_kvs_handle fStack_4e0;
  fdb_kvs_handle *local_2b0;
  fdb_kvs_handle *local_2a8;
  fdb_file_handle *local_2a0;
  fdb_doc *local_298;
  fdb_iterator *local_290;
  fdb_snapshot_info_t *local_288;
  uint64_t local_280;
  fdb_kvs_info local_278;
  timeval local_248;
  fdb_kvs_config local_238;
  fdb_config local_220;
  char local_128 [256];
  
  gettimeofday(&local_248,(__timezone_ptr_t)0x0);
  memleak_start();
  local_298 = (fdb_doc *)0x0;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_220.wal_threshold = 0x400;
  local_220.flags = 1;
  local_220.block_reusing_threshold = 0;
  fdb_open(&local_2a0,"./compact_test1",&local_220);
  fdb_kvs_open_default(local_2a0,&local_2a8,&local_238);
  pcVar8 = "key%d";
  pcVar10 = (char *)0x0;
  do {
    sprintf(local_128,"key%d",pcVar10);
    pfVar5 = local_2a8;
    sVar3 = strlen(local_128);
    pfVar12 = pfVar5;
    fVar1 = fdb_set_kv(pfVar5,local_128,sVar3,"value",5);
    iVar2 = (int)pfVar12;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      compact_upto_post_snapshot_test();
      goto LAB_00112a8e;
    }
    fdb_commit(local_2a0,'\x01');
    uVar9 = (int)pcVar10 + 1;
    pcVar10 = (char *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfVar12 = local_2a8;
  fVar1 = fdb_get_kvs_info(local_2a8,&local_278);
  iVar2 = (int)pfVar12;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a9d;
  pcVar8 = (char *)&local_278.last_seqnum;
  if (local_278.last_seqnum != 10) {
    compact_upto_post_snapshot_test();
  }
  pfVar12 = local_2a8;
  fVar1 = fdb_snapshot_open(local_2a8,&local_2b0,5);
  iVar2 = (int)pfVar12;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aa2;
  pfVar12 = local_2b0;
  fVar1 = fdb_get_kvs_info(local_2b0,&local_278);
  iVar2 = (int)pfVar12;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aa7;
  if (local_278.last_seqnum != 5) {
    compact_upto_post_snapshot_test();
  }
  pfVar13 = local_2a0;
  fVar1 = fdb_get_all_snap_markers(local_2a0,&local_288,&local_280);
  iVar2 = (int)pfVar13;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aac;
  pfVar13 = local_2a0;
  fVar1 = fdb_compact_upto(local_2a0,(char *)0x0,local_288[5].marker);
  iVar2 = (int)pfVar13;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ab1;
  fVar1 = fdb_free_snap_markers(local_288,local_280);
  iVar2 = (int)local_288;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ab6;
  pfVar12 = local_2a8;
  fVar1 = fdb_get_kvs_info(local_2a8,&local_278);
  iVar2 = (int)pfVar12;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112abb;
  if (local_278.last_seqnum != 10) {
    compact_upto_post_snapshot_test();
  }
  pfVar12 = local_2b0;
  fVar1 = fdb_get_kvs_info(local_2b0,&local_278);
  iVar2 = (int)pfVar12;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ac0;
  if (local_278.last_seqnum != 5) {
    compact_upto_post_snapshot_test();
  }
  pfVar12 = local_2b0;
  fVar1 = fdb_iterator_init(local_2b0,&local_290,(void *)0x0,0,(void *)0x0,0,0);
  iVar2 = (int)pfVar12;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ac5;
  pcVar10 = (char *)0x5;
  do {
    pfVar14 = local_290;
    fVar1 = fdb_iterator_get(local_290,&local_298);
    iVar2 = (int)pfVar14;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a8e;
    fdb_doc_free(local_298);
    local_298 = (fdb_doc *)0x0;
    pfVar12 = local_2a8;
    fVar1 = fdb_get_kvs_info(local_2a8,&local_278);
    iVar2 = (int)pfVar12;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a93;
    if (local_278.last_seqnum != 10) {
      compact_upto_post_snapshot_test();
    }
    pfVar12 = local_2b0;
    fVar1 = fdb_get_kvs_info(local_2b0,&local_278);
    iVar2 = (int)pfVar12;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a98;
    if (local_278.last_seqnum != 5) {
      compact_upto_post_snapshot_test();
    }
    pfVar14 = local_290;
    fVar1 = fdb_iterator_next(local_290);
    iVar2 = (int)pfVar14;
    uVar9 = (int)pcVar10 - 1;
    pcVar10 = (char *)(ulong)uVar9;
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  if (uVar9 == 0) {
    fdb_iterator_close(local_290);
    fdb_kvs_close(local_2b0);
    fdb_close(local_2a0);
    fdb_shutdown();
    memleak_end();
    pcVar8 = "%s PASSED\n";
    if (compact_upto_post_snapshot_test()::__test_pass != '\0') {
      pcVar8 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar8,"compact upto post snapshot test");
    return;
  }
  goto LAB_00112aca;
LAB_00113134:
  pbStackY_6a8 = (btree *)0x113139;
  compact_upto_overwrite_test();
LAB_00113139:
  pbStackY_6a8 = (btree *)0x11313e;
  compact_upto_overwrite_test();
LAB_0011313e:
  pbStackY_6a8 = (btree *)0x113143;
  compact_upto_overwrite_test();
LAB_00113143:
  pbStackY_6a8 = (btree *)0x113153;
  compact_upto_overwrite_test();
LAB_00113153:
  pbStackY_6a8 = (btree *)0x11315e;
  compact_upto_overwrite_test();
LAB_0011315e:
  pbStackY_6a8 = (btree *)0x113163;
  compact_upto_overwrite_test();
LAB_00113163:
  pbStackY_6a8 = (btree *)0x113168;
  compact_upto_overwrite_test();
LAB_00113168:
  pbStackY_6a8 = (btree *)0x11316d;
  compact_upto_overwrite_test();
LAB_0011316d:
  pbStackY_6a8 = (btree *)0x113172;
  compact_upto_overwrite_test();
LAB_00113172:
  pbStackY_6a8 = (btree *)0x113177;
  compact_upto_overwrite_test();
LAB_00113177:
  pbStackY_6a8 = (btree *)0x11317c;
  compact_upto_overwrite_test();
  goto LAB_0011317c;
LAB_00112a8e:
  compact_upto_post_snapshot_test();
LAB_00112a93:
  compact_upto_post_snapshot_test();
LAB_00112a98:
  compact_upto_post_snapshot_test();
LAB_00112a9d:
  compact_upto_post_snapshot_test();
LAB_00112aa2:
  compact_upto_post_snapshot_test();
LAB_00112aa7:
  compact_upto_post_snapshot_test();
LAB_00112aac:
  compact_upto_post_snapshot_test();
LAB_00112ab1:
  compact_upto_post_snapshot_test();
LAB_00112ab6:
  compact_upto_post_snapshot_test();
LAB_00112abb:
  compact_upto_post_snapshot_test();
LAB_00112ac0:
  compact_upto_post_snapshot_test();
LAB_00112ac5:
  compact_upto_post_snapshot_test();
LAB_00112aca:
  compact_upto_post_snapshot_test();
  fStack_4e0.bub_ctx.handle = pfVar5;
  pfVar12 = (fdb_kvs_handle *)0x0;
  pbStackY_6a8 = (btree *)0x112af6;
  iStack_684 = iVar2;
  fStack_4e0.bub_ctx.space_used = (uint64_t)pcVar8;
  gettimeofday(&tStack_520,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_620,"rm -rf  compact_test* > errorlog.txt",0x25);
  pbStackY_6a8 = (btree *)0x112b26;
  system(acStack_620);
  pbStackY_6a8 = (btree *)0x112b2b;
  memleak_start();
  pbStackY_6a8 = (btree *)0x112b35;
  pcVar8 = (char *)malloc(0x20);
  fconfig_00 = (fdb_config *)(auStack_510 + 0x130);
  pbStackY_6a8 = (btree *)0x112b48;
  fdb_get_default_config();
  fStack_4e0.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_4e0.config.encryption_key.bytes[0x1d] = '\x02';
  fStack_4e0.config.encryption_key.bytes[0x14] = 1;
  fStack_4e0.config.num_keeping_headers._0_1_ = 1;
  fStack_4e0.config.encryption_key.bytes[4] = '\0';
  fStack_4e0.config.encryption_key.bytes[5] = '\0';
  fStack_4e0.config.encryption_key.bytes[6] = '\0';
  fStack_4e0.config.encryption_key.bytes[7] = '\0';
  fStack_4e0.config.encryption_key.bytes[8] = '\0';
  fStack_4e0.config.encryption_key.bytes[9] = '\0';
  fStack_4e0.config.encryption_key.bytes[10] = '\0';
  fStack_4e0.config.encryption_key.bytes[0xb] = '\0';
  fStack_4e0.max_seqnum = 0;
  pbStackY_6a8 = (btree *)0x112b6b;
  fdb_get_default_kvs_config();
  pbStackY_6a8 = (btree *)0x112b7f;
  fVar1 = fdb_open(&pfStack_678,"./compact_test",fconfig_00);
  if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011317c:
    pbStackY_6a8 = (btree *)0x113181;
    compact_upto_overwrite_test();
LAB_00113181:
    pbStackY_6a8 = (btree *)0x113186;
    compact_upto_overwrite_test();
LAB_00113186:
    pbStackY_6a8 = (btree *)0x11318b;
    compact_upto_overwrite_test();
LAB_0011318b:
    pbStackY_6a8 = (btree *)0x113190;
    compact_upto_overwrite_test();
LAB_00113190:
    pbStackY_6a8 = (btree *)0x113195;
    compact_upto_overwrite_test();
LAB_00113195:
    pbStackY_6a8 = (btree *)0x11319a;
    compact_upto_overwrite_test();
LAB_0011319a:
    pbStackY_6a8 = (btree *)0x11319f;
    compact_upto_overwrite_test();
LAB_0011319f:
    pbStackY_6a8 = (btree *)0x1131a4;
    compact_upto_overwrite_test();
LAB_001131a4:
    pbStackY_6a8 = (btree *)0x1131a9;
    compact_upto_overwrite_test();
LAB_001131a9:
    pbStackY_6a8 = (btree *)compact_with_snapshot_open_test;
    compact_upto_overwrite_test();
    pcStackY_a40 = (code *)0x1131cb;
    pfStackY_6d0 = fconfig_00;
    pfStackY_6c8 = pfVar5;
    pfStackY_6c0 = unaff_R13;
    pcStackY_6b8 = pcVar8;
    pfStackY_6b0 = pfVar12;
    pbStackY_6a8 = (btree *)pcVar10;
    gettimeofday(&tStackY_9f8,(__timezone_ptr_t)0x0);
    pcStackY_a40 = (code *)0x1131d0;
    memleak_start();
    pcStackY_a40 = (code *)0x1131dd;
    fdb_get_default_config();
    pcStackY_a40 = (code *)0x1131ea;
    fdb_get_default_kvs_config();
    fStackY_9d0.compaction_cb_ctx = &uStackY_a18;
    uStackY_a18 = 0;
    uStackY_a10 = 0;
    pfStackY_a08 = (fdb_kvs_handle *)0x0;
    fStackY_9d0.wal_threshold = 0x400;
    fStackY_9d0.flags = 1;
    fStackY_9d0.compaction_cb = compaction_cb_get;
    fStackY_9d0.compaction_cb_mask = 0x1b;
    pcStackY_a40 = (code *)0x113230;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_a40 = (code *)0x113245;
    fdb_open((fdb_file_handle **)&pfStackY_a38,"./compact_test1",&fStackY_9d0);
    pcStackY_a40 = (code *)0x11325f;
    fdb_kvs_open((fdb_file_handle *)pfStackY_a38,&pfStackY_a20,"db",&fStackY_9e8);
    pcStackY_a40 = (code *)0x113272;
    fdb_kvs_open((fdb_file_handle *)pfStackY_a38,&pfStackY_a30,"db",&fStackY_9e8);
    uVar6 = 0;
    do {
      pcStackY_a40 = (code *)0x11329e;
      sprintf((char *)apfStackY_7d8,"key%04d",uVar6);
      pcStackY_a40 = (code *)0x1132ad;
      sprintf(acStackY_8d8,"body%04d",uVar6);
      pfVar5 = pfStackY_a20;
      pcStackY_a40 = (code *)0x1132ba;
      sVar3 = strlen((char *)apfStackY_7d8);
      pcStackY_a40 = (code *)0x1132c5;
      sVar4 = strlen(acStackY_8d8);
      pcStackY_a40 = (code *)0x1132d9;
      ptr_handle = apfStackY_7d8;
      pfVar12 = pfVar5;
      fVar1 = fdb_set_kv(pfVar5,apfStackY_7d8,sVar3,acStackY_8d8,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_a40 = (code *)0x11339e;
        compact_with_snapshot_open_test();
        goto LAB_0011339e;
      }
      uVar9 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar9;
    } while (uVar9 != 100000);
    ptr_handle = (fdb_kvs_handle **)0x1;
    pcStackY_a40 = (code *)0x1132f9;
    pfVar12 = pfStackY_a38;
    fVar1 = fdb_commit((fdb_file_handle *)pfStackY_a38,'\x01');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_a08 = pfStackY_a30;
      ptr_handle = (fdb_kvs_handle **)0x0;
      pcStackY_a40 = (code *)0x113316;
      pfVar12 = pfStackY_a38;
      fVar1 = fdb_compact((fdb_file_handle *)pfStackY_a38,(char *)0x0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a3;
      ptr_handle = &pfStackY_a28;
      pcStackY_a40 = (code *)0x113332;
      pfVar12 = pfStackY_a30;
      fVar1 = fdb_snapshot_open(pfStackY_a30,ptr_handle,100000);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a8;
      pcStackY_a40 = (code *)0x113340;
      fdb_kvs_close(pfStackY_a28);
      pcStackY_a40 = (code *)0x113349;
      fVar1 = fdb_close((fdb_file_handle *)pfStackY_a38);
      pfVar12 = pfStackY_a38;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133ad;
      pcStackY_a40 = (code *)0x113352;
      fVar1 = fdb_shutdown();
      pfVar12 = pfStackY_a38;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar8 = "%s PASSED\n";
        if (compact_with_snapshot_open_test()::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        pcStackY_a40 = (code *)0x113387;
        fprintf(_stderr,pcVar8,"compact with snapshot_open test");
        return;
      }
    }
    else {
LAB_0011339e:
      pcStackY_a40 = (code *)0x1133a3;
      compact_with_snapshot_open_test();
LAB_001133a3:
      pcStackY_a40 = (code *)0x1133a8;
      compact_with_snapshot_open_test();
LAB_001133a8:
      pcStackY_a40 = (code *)0x1133ad;
      compact_with_snapshot_open_test();
LAB_001133ad:
      pcStackY_a40 = (code *)0x1133b2;
      compact_with_snapshot_open_test();
    }
    pcStackY_a40 = compaction_cb_get;
    compact_with_snapshot_open_test();
    pcStackY_a88 = (code *)0x1133d3;
    sStackY_a50 = sVar3;
    ppfStackY_a48 = apfStackY_7d8;
    pcStackY_a40 = (code *)uVar6;
    gettimeofday(&tStackY_a60,(__timezone_ptr_t)0x0);
    if ((int)ptr_handle == 2) {
      if (extraout_RDX == 0) {
        pcStackY_a88 = (code *)0x1133e2;
        compaction_cb_get();
        goto LAB_001133e2;
      }
    }
    else {
LAB_001133e2:
      if (extraout_RDX != 0) goto LAB_00113449;
    }
    pcStackY_a88 = (code *)0x1133f9;
    fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar12,&pfStackY_a78,&uStackY_a68);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_a88 = (code *)0x11341d;
      fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(pfStackY_a30->kvs_config).custom_cmp_param,
                                &pfStackY_a70,pfStackY_a78->kvs_markers->seqnum);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011343f;
      pcStackY_a88 = (code *)0x11342b;
      fVar1 = fdb_kvs_close(pfStackY_a70);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        return;
      }
    }
    else {
      pcStackY_a88 = (code *)0x11343f;
      compaction_cb_get();
LAB_0011343f:
      pcStackY_a88 = (code *)0x113444;
      compaction_cb_get();
    }
    pcStackY_a88 = (code *)0x113449;
    compaction_cb_get();
LAB_00113449:
    pcStackY_a88 = compact_with_snapshot_open_multi_kvs_test;
    compaction_cb_get();
    pcStackY_a90 = "body%04d";
    pfStackY_aa0 = pfVar5;
    pcStackY_e40 = (code *)0x11346b;
    pcStackY_aa8 = acStackY_8d8;
    pcStackY_a88 = (code *)((ulong)ptr_handle & 0xffffffff);
    gettimeofday(&tStackY_dd8,(__timezone_ptr_t)0x0);
    pcStackY_e40 = (code *)0x113470;
    memleak_start();
    pcStackY_e40 = (code *)0x113480;
    fdb_get_default_config();
    pcStackY_e40 = (code *)0x11348d;
    fdb_get_default_kvs_config();
    fStackY_db0.compaction_cb_ctx = &uStackY_df8;
    uStackY_df8 = 0;
    uStackY_df0 = 0;
    uStackY_de8 = 0;
    fStackY_db0.wal_threshold = 0x400;
    fStackY_db0.flags = 1;
    fStackY_db0.compaction_cb = compaction_cb_markers;
    fStackY_db0.compaction_cb_mask = 0x1b;
    pcStackY_e40 = (code *)0x1134d3;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_e40 = (code *)0x1134ea;
    fdb_open(&pfStackY_e30,"./compact_test1",&fStackY_db0);
    pcStackY_e40 = (code *)0x113501;
    fdb_kvs_open(pfStackY_e30,&pfStackY_e00,"db1",&fStackY_dc8);
    pcStackY_e40 = (code *)0x113518;
    fdb_kvs_open(pfStackY_e30,&pfStackY_e08,"db2",&fStackY_dc8);
    pcStackY_e40 = (code *)0x11352f;
    fdb_kvs_open(pfStackY_e30,&pfStackY_e10,"db3",&fStackY_dc8);
    pcStackY_e40 = (code *)0x113546;
    fdb_kvs_open(pfStackY_e30,&pfStackY_e18,"db4",&fStackY_dc8);
    pcStackY_e40 = (code *)0x11355d;
    fdb_kvs_open(pfStackY_e30,&pfStackY_e20,"db5",&fStackY_dc8);
    uVar6 = 0;
    do {
      iVar2 = (int)uVar6;
      if (iVar2 == 5) goto LAB_001136e1;
      uVar6 = 0;
      iStackY_e24 = iVar2;
      do {
        pcStackY_e40 = (code *)0x11359b;
        sprintf(acStackY_bb8,"key%04d",uVar6);
        pcStackY_e40 = (code *)0x1135aa;
        sprintf(acStackY_cb8,"body%04d",uVar6);
        pfVar5 = pfStackY_e00;
        pcStackY_e40 = (code *)0x1135b7;
        sVar3 = strlen(acStackY_bb8);
        pcStackY_e40 = (code *)0x1135c5;
        sVar4 = strlen(acStackY_cb8);
        pcStackY_e40 = (code *)0x1135d9;
        fdb_set_kv(pfVar5,acStackY_bb8,sVar3,acStackY_cb8,sVar4);
        pfVar5 = pfStackY_e08;
        pcStackY_e40 = (code *)0x1135e6;
        sVar3 = strlen(acStackY_bb8);
        pcStackY_e40 = (code *)0x1135f1;
        sVar4 = strlen(acStackY_cb8);
        pcStackY_e40 = (code *)0x113605;
        fdb_set_kv(pfVar5,acStackY_bb8,sVar3,acStackY_cb8,sVar4);
        pfVar5 = pfStackY_e10;
        pcStackY_e40 = (code *)0x113612;
        sVar3 = strlen(acStackY_bb8);
        pcStackY_e40 = (code *)0x11361d;
        sVar4 = strlen(acStackY_cb8);
        pcStackY_e40 = (code *)0x113631;
        fdb_set_kv(pfVar5,acStackY_bb8,sVar3,acStackY_cb8,sVar4);
        pfVar5 = pfStackY_e18;
        pcStackY_e40 = (code *)0x11363e;
        sVar3 = strlen(acStackY_bb8);
        pcStackY_e40 = (code *)0x113649;
        sVar4 = strlen(acStackY_cb8);
        pcStackY_e40 = (code *)0x11365d;
        fdb_set_kv(pfVar5,acStackY_bb8,sVar3,acStackY_cb8,sVar4);
        pfVar12 = pfStackY_e20;
        pcStackY_e40 = (code *)0x11366a;
        pfVar5 = (fdb_kvs_handle *)strlen(acStackY_bb8);
        pcStackY_e40 = (code *)0x113675;
        sVar3 = strlen(acStackY_cb8);
        pcStackY_e40 = (code *)0x113693;
        fdb_set_kv(pfVar12,acStackY_bb8,(size_t)pfVar5,acStackY_cb8,sVar3);
        uVar9 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar9;
      } while (uVar9 != 1000);
      pcStackY_e40 = (code *)0x1136b0;
      pfVar13 = pfStackY_e30;
      fVar1 = fdb_commit(pfStackY_e30,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_e40 = (code *)0x113740;
        compact_with_snapshot_open_multi_kvs_test();
        goto LAB_00113740;
      }
      uVar6 = (ulong)(iStackY_e24 + 1U);
      uStackY_df8 = CONCAT44(uStackY_df8._4_4_,(iStackY_e24 + 1U) * 1000);
      pcStackY_e40 = (code *)0x1136d4;
      fVar1 = fdb_compact(pfStackY_e30,(char *)0x0);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    pcStackY_e40 = (code *)0x1136e1;
    compact_with_snapshot_open_multi_kvs_test();
LAB_001136e1:
    pcStackY_e40 = (code *)0x1136eb;
    pfVar13 = pfStackY_e30;
    fVar1 = fdb_close(pfStackY_e30);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_e40 = (code *)0x1136f4;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar8 = "%s PASSED\n";
        if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        pcStackY_e40 = (code *)0x113729;
        fprintf(_stderr,pcVar8,"compact with snapshot_open multi kvs test");
        return;
      }
    }
    else {
LAB_00113740:
      pcStackY_e40 = (code *)0x113745;
      compact_with_snapshot_open_multi_kvs_test();
    }
    pcStackY_e40 = compaction_cb_markers;
    compact_with_snapshot_open_multi_kvs_test();
    pcStackY_e48 = "body%04d";
    pcStackY_e68 = "key%04d";
    pcStackY_eb8 = (code *)0x11376f;
    pcStackY_e60 = acStackY_cb8;
    pfStackY_e58 = pfVar5;
    pcStackY_e50 = acStackY_bb8;
    pcStackY_e40 = (code *)uVar6;
    gettimeofday(&tStackY_e78,(__timezone_ptr_t)0x0);
    pcStackY_eb8 = (code *)0x113779;
    fdb_get_default_kvs_config();
    iVar2 = *(int *)&pfStackY_e30->root;
    pcStackY_eb8 = (code *)0x11378c;
    fVar1 = fdb_get_all_snap_markers(pfVar13,(fdb_snapshot_info_t **)&pfStackY_eb0,&uStackY_ea0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfVar5 = pfStackY_eb0;
      if ((pfStackY_eb0->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x6) {
        pcStackY_eb8 = (code *)0x113870;
        compaction_cb_markers();
        pfVar5 = pfStackY_ea8;
      }
      if (*(fdb_seqnum_t *)((long)(pfVar5->kvs_config).custom_cmp_param + 8) == (long)iVar2) {
        if (uStackY_ea0 != 0) {
          uVar11 = 0;
          uVar6 = uStackY_ea0;
          do {
            if ((&pfVar5->kvs_config)[uVar11].custom_cmp != (fdb_custom_cmp_variable)0x0) {
              lVar16 = 0;
              p_Var17 = (fdb_custom_cmp_variable)0x0;
              do {
                pcVar8 = *(char **)((long)(&pfVar5->kvs_config)[uVar11].custom_cmp_param + lVar16);
                if (pcVar8 != (char *)0x0) {
                  pcStackY_eb8 = (code *)0x1137fa;
                  fdb_kvs_open(pfVar13,&pfStackY_ea8,pcVar8,&fStackY_e90);
                  pcStackY_eb8 = (code *)0x11380c;
                  fVar1 = fdb_snapshot_open(pfStackY_ea8,&pfStackY_e98,(long)iVar2);
                  if (fVar1 == FDB_RESULT_SUCCESS) {
                    pcStackY_eb8 = (code *)0x11381a;
                    fVar1 = fdb_kvs_close(pfStackY_e98);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      pcStackY_eb8 = (code *)0x11387d;
                      compaction_cb_markers();
                      goto LAB_0011387d;
                    }
                    pcStackY_eb8 = (code *)0x113828;
                    fVar1 = fdb_kvs_close(pfStackY_ea8);
                    pfVar5 = pfStackY_eb0;
                    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113830;
                  }
                  else {
LAB_0011387d:
                    pcStackY_eb8 = (code *)0x113882;
                    compaction_cb_markers();
                  }
                  pcStackY_eb8 = (code *)0x113887;
                  compaction_cb_markers();
                  goto LAB_00113887;
                }
LAB_00113830:
                p_Var17 = p_Var17 + 1;
                lVar16 = lVar16 + 0x10;
                uVar6 = uStackY_ea0;
              } while (p_Var17 < (&pfVar5->kvs_config)[uVar11].custom_cmp);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar6);
        }
        return;
      }
    }
    else {
LAB_00113887:
      pcStackY_eb8 = (code *)0x11388c;
      compaction_cb_markers();
    }
    pcStackY_eb8 = db_compact_during_compaction_cancellation;
    compaction_cb_markers();
    gettimeofday(&tStackY_fc0,(__timezone_ptr_t)0x0);
    fdb_get_default_config();
    fStackY_fb0.compaction_cb = cb_cancel_test;
    fStackY_fb0.compaction_cb_ctx = (void *)0x0;
    fStackY_fb0.compaction_cb_mask = 0x11;
    fVar1 = fdb_open(&pfStackY_fc8,"compact_test",&fStackY_fb0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xcac);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
    }
    fVar1 = fdb_compact(pfStackY_fc8,(char *)0x0);
    if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
       ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
      fdb_close(pfStackY_fc8);
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcb1);
    __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
  }
  pbStackY_6a8 = (btree *)0x112ba2;
  fVar1 = fdb_kvs_open(pfStack_678,&pfStack_670,"db",&fStack_638);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113181;
  pfVar5 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)pfVar5 >> 8),iStack_684 == 0);
  pcStack_668 = pcVar8 + 0x1a;
  unaff_R13 = (fdb_kvs_handle *)(auStack_510 + 0x30);
  pcVar10 = auStack_510;
  fconfig_00 = (fdb_config *)0x0;
  do {
    uVar9 = (uint)fconfig_00;
    pfVar7 = (fdb_config *)(ulong)(uVar9 - 5);
    if (uVar9 < 5) {
      pfVar7 = fconfig_00;
    }
    pbStackY_6a8 = (btree *)0x112bea;
    sprintf((char *)unaff_R13,"key%06d",pfVar7);
    builtin_strncpy(pcVar8,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(pcStack_668,"<end>",6);
    pfVar7 = (fdb_config *)(ulong)(uVar9 - 5);
    if (uVar9 < 5) {
      __format = "value%08d";
      pfVar7 = fconfig_00;
    }
    else {
      __format = "updated_value%08d";
    }
    pbStackY_6a8 = (btree *)0x112c2e;
    sprintf(pcVar8,__format,pfVar7);
    pfVar12 = pfStack_670;
    pbStackY_6a8 = (btree *)0x112c3b;
    sVar3 = strlen((char *)unaff_R13);
    pbStackY_6a8 = (btree *)0x112c53;
    fVar1 = fdb_set_kv(pfVar12,unaff_R13,sVar3 + 1,pcVar8,0x20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113134;
    pfVar7 = fconfig_00;
    if (iStack_684 == 3) {
LAB_00112c74:
      pfVar5 = (fdb_kvs_handle *)((ulong)pfVar7 & 0xffffffffffffff01);
    }
    else if (iStack_684 == 2) {
      pfVar7 = (fdb_config *)CONCAT71((int7)((ulong)fconfig_00 >> 8),~(byte)fconfig_00);
      goto LAB_00112c74;
    }
    pbStackY_6a8 = (btree *)0x112c86;
    fVar1 = fdb_commit(pfStack_678,(fdb_commit_opt_t)pfVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113139;
    pbStackY_6a8 = (btree *)0x112c9b;
    fVar1 = fdb_get_kvs_info(pfStack_670,(fdb_kvs_info *)pcVar10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011313e;
    fconfig_00 = (fdb_config *)(ulong)(uVar9 + 1);
  } while (uVar9 + 1 != 10);
  pbStackY_6a8 = (btree *)0x112cc2;
  fVar1 = fdb_get_all_snap_markers(pfStack_678,&pfStack_658,(uint64_t *)&iStack_660);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113186;
  fconfig_00 = (fdb_config *)(CONCAT44(uStack_65c,iStack_660) >> 1);
  pbStackY_6a8 = (btree *)0x112cf3;
  fVar1 = fdb_compact_upto(pfStack_678,"./compact_test2",pfStack_658[(int)fconfig_00].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011318b;
  if (-1 < (int)(iStack_660 - 1U)) {
    pfVar5 = (fdb_kvs_handle *)(ulong)(iStack_660 - 1U);
    lStack_640 = (long)(int)fconfig_00;
    fconfig_00 = (fdb_config *)(auStack_510 + 0x30);
    do {
      pfVar12 = (fdb_kvs_handle *)(pfStack_658[(long)pfVar5].kvs_markers)->seqnum;
      pbStackY_6a8 = (btree *)0x112d3e;
      fVar1 = fdb_snapshot_open(pfStack_670,&pfStack_650,(fdb_seqnum_t)pfVar12);
      if (lStack_640 < (long)pfVar5) {
        pfVar15 = pfVar5;
        if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011315e;
      }
      else {
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113163;
        pbStackY_6a8 = (btree *)0x112d7f;
        pfStack_648 = pfVar5;
        fVar1 = fdb_iterator_init(pfStack_650,&pfStack_690,(void *)0x0,0,(void *)0x0,0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113168;
        pfVar12 = (fdb_kvs_handle *)((long)&pfVar12[-1].bub_ctx.handle + 3);
        pfVar5 = (fdb_kvs_handle *)0x0;
        do {
          pfStack_680 = (fdb_kvs_handle *)0x0;
          pbStackY_6a8 = (btree *)0x112da6;
          fVar1 = fdb_iterator_get(pfStack_690,(fdb_doc **)&pfStack_680);
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pbStackY_6a8 = (btree *)0x112dc2;
          sprintf((char *)fconfig_00,"key%06d",(ulong)pfVar5 & 0xffffffff);
          builtin_strncpy(pcVar8,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
          builtin_strncpy(pcStack_668,"<end>",6);
          pcVar10 = "value%08d";
          if (pfVar5 < pfVar12) {
            pcVar10 = "updated_value%08d";
          }
          pbStackY_6a8 = (btree *)0x112e05;
          sprintf(pcVar8,pcVar10,(ulong)pfVar5 & 0xffffffff);
          unaff_R13 = pfStack_680;
          pcVar10 = (char *)pfStack_680->op_stats;
          pbStackY_6a8 = (btree *)0x112e1d;
          iVar2 = bcmp(pcVar10,fconfig_00,*(size_t *)&pfStack_680->kvs_config);
          if (iVar2 != 0) {
            pbStackY_6a8 = (btree *)0x113129;
            compact_upto_overwrite_test();
LAB_00113129:
            pbStackY_6a8 = (btree *)0x113134;
            compact_upto_overwrite_test();
            goto LAB_00113134;
          }
          pcVar10 = (char *)(unaff_R13->field_6).seqtree;
          pbStackY_6a8 = (btree *)0x112e38;
          iVar2 = bcmp(pcVar10,pcVar8,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
          if (iVar2 != 0) goto LAB_00113129;
          pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
          pbStackY_6a8 = (btree *)0x112e4b;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pbStackY_6a8 = (btree *)0x112e55;
          fVar1 = fdb_iterator_next(pfStack_690);
        } while (fVar1 == FDB_RESULT_SUCCESS);
        pbStackY_6a8 = (btree *)0x112e67;
        fVar1 = fdb_iterator_close(pfStack_690);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011316d;
        if ((int)pfVar5 != 5) goto LAB_00113177;
        pbStackY_6a8 = (btree *)0x112e83;
        fVar1 = fdb_kvs_close(pfStack_650);
        pfVar5 = pfStack_648;
        pfVar15 = pfStack_648;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113172;
      }
      pfVar5 = (fdb_kvs_handle *)((long)&pfVar15[-1].bub_ctx.handle + 7);
    } while (0 < (long)pfVar15);
  }
  pbStackY_6a8 = (btree *)0x112ec1;
  fVar1 = fdb_iterator_init(pfStack_670,&pfStack_690,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113190;
  unaff_R13 = (fdb_kvs_handle *)(auStack_510 + 0x30);
  pcVar10 = "updated_value%08d";
  fconfig_00 = (fdb_config *)0x0;
  do {
    pfStack_680 = (fdb_kvs_handle *)0x0;
    pbStackY_6a8 = (btree *)0x112ef2;
    fVar1 = fdb_iterator_get(pfStack_690,(fdb_doc **)&pfStack_680);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pbStackY_6a8 = (btree *)0x112f0d;
    sprintf((char *)unaff_R13,"key%06d",fconfig_00);
    builtin_strncpy(pcVar8,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(pcStack_668,"<end>",6);
    pbStackY_6a8 = (btree *)0x112f3d;
    sprintf(pcVar8,"updated_value%08d",fconfig_00);
    pfVar12 = pfStack_680;
    pfVar5 = (fdb_kvs_handle *)pfStack_680->op_stats;
    pbStackY_6a8 = (btree *)0x112f54;
    iVar2 = bcmp(pfVar5,unaff_R13,*(size_t *)&pfStack_680->kvs_config);
    if (iVar2 != 0) goto LAB_00113143;
    pfVar5 = (fdb_kvs_handle *)(pfVar12->field_6).seqtree;
    pbStackY_6a8 = (btree *)0x112f6f;
    iVar2 = bcmp(pfVar5,pcVar8,(size_t)(pfVar12->kvs_config).custom_cmp_param);
    if (iVar2 != 0) goto LAB_00113153;
    fconfig_00 = (fdb_config *)(ulong)((int)fconfig_00 + 1);
    pbStackY_6a8 = (btree *)0x112f81;
    fdb_doc_free((fdb_doc *)pfVar12);
    pbStackY_6a8 = (btree *)0x112f8b;
    fVar1 = fdb_iterator_next(pfStack_690);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pbStackY_6a8 = (btree *)0x112f9d;
  fVar1 = fdb_iterator_close(pfStack_690);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113195;
  if ((int)fconfig_00 != 5) goto LAB_0011319a;
  pbStackY_6a8 = (btree *)0x112fbd;
  fVar1 = fdb_free_snap_markers(pfStack_658,CONCAT44(uStack_65c,iStack_660));
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011319f;
  pbStackY_6a8 = (btree *)0x112fcd;
  free(pcVar8);
  pbStackY_6a8 = (btree *)0x112fd7;
  fVar1 = fdb_close(pfStack_678);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001131a4;
  pbStackY_6a8 = (btree *)0x112fe4;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001131a9;
  pbStackY_6a8 = (btree *)0x112ff1;
  memleak_end();
  builtin_strncpy(acStack_620 + 0x10,"rwrite test",0xc);
  builtin_strncpy(acStack_620,"compact upto ove",0x10);
  switch(iStack_684) {
  case 0:
    pbStackY_6a8 = (btree *)0x11303b;
    sVar3 = strlen(acStack_620);
    builtin_strncpy(acStack_620 + sVar3," (HB+trie)",0xb);
    break;
  case 1:
    pbStackY_6a8 = (btree *)0x1130bf;
    sVar3 = strlen(acStack_620);
    builtin_strncpy(acStack_620 + sVar3," (WAL)",7);
    break;
  case 2:
    pbStackY_6a8 = (btree *)0x113067;
    sVar3 = strlen(acStack_620);
    builtin_strncpy(acStack_620 + sVar3 + 0xe,"ie/WAL)",8);
    uVar18._0_1_ = ' ';
    uVar18._1_1_ = 'H';
    uVar18._2_1_ = 'B';
    uVar18._3_1_ = '+';
    uVar19._0_1_ = 't';
    uVar19._1_1_ = 'r';
    uVar19._2_1_ = 'i';
    uVar19._3_1_ = 'e';
    goto LAB_001130a8;
  case 3:
    pbStackY_6a8 = (btree *)0x11308f;
    sVar3 = strlen(acStack_620);
    builtin_strncpy(acStack_620 + sVar3 + 0xe,"B+trie)",8);
    uVar18._0_1_ = ' ';
    uVar18._1_1_ = 'W';
    uVar18._2_1_ = 'A';
    uVar18._3_1_ = 'L';
    uVar19._0_1_ = '/';
    uVar19._1_1_ = 'H';
    uVar19._2_1_ = 'B';
    uVar19._3_1_ = '+';
LAB_001130a8:
    pcVar8 = acStack_620 + sVar3;
    pcVar8[0] = ' ';
    pcVar8[1] = '(';
    pcVar8[2] = 'm';
    pcVar8[3] = 'i';
    pcVar8 = acStack_620 + sVar3 + 4;
    pcVar8[0] = 'x';
    pcVar8[1] = 'e';
    pcVar8[2] = 'd';
    pcVar8[3] = ',';
    *(undefined4 *)(acStack_620 + sVar3 + 8) = uVar18;
    *(undefined4 *)(acStack_620 + sVar3 + 0xc) = uVar19;
  }
  pcVar8 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar8 = "%s FAILED\n";
  }
  pbStackY_6a8 = (btree *)0x113107;
  fprintf(_stderr,pcVar8,acStack_620);
  return;
}

Assistant:

void compact_upto_post_snapshot_test()
{
    TEST_INIT();
    memleak_start();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_doc *rdoc = NULL;
    fdb_kvs_info kvs_info;
    uint64_t num_markers;
    char keybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    // prevent block reusing to keep snapshots
    fconfig.block_reusing_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    }

    // check  db info
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 10);

    // open snapshot at seqnum 5
    status = fdb_snapshot_open(db, &snap_db, 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snap info
    status = fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 5);


    // compact upto
    status = fdb_get_all_snap_markers(dbfile, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_compact_upto(dbfile, NULL, markers[5].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check db and snap info
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 10);
    status = fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 5);


    // iterate over snapshot
    status = fdb_iterator_init(snap_db,
                               &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 0;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;

        // check db and snap info
        status = fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(kvs_info.last_seqnum == 10);
        status = fdb_get_kvs_info(snap_db, &kvs_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(kvs_info.last_seqnum == 5);
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(i == 5);

    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact upto post snapshot test");
}